

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

int __thiscall AggressiveBotStrategy::reinforceArmyCount(AggressiveBotStrategy *this)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  int iVar2;
  Country *pCVar3;
  pointer ppCVar4;
  
  pvVar1 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
  pCVar3 = (Country *)0x0;
  for (ppCVar4 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      ppCVar4 !=
      (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; ppCVar4 = ppCVar4 + 1) {
    if ((pCVar3 == (Country *)0x0) || (*pCVar3->pNumberOfTroops < *(*ppCVar4)->pNumberOfTroops)) {
      pCVar3 = *ppCVar4;
    }
  }
  if ((pCVar3 == (Country *)0x0) || (*pCVar3->cyID != *((this->super_PlayerStrategy).to)->cyID)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0",1);
    iVar2 = 0;
  }
  else {
    std::ostream::operator<<(&std::cout,*(this->super_PlayerStrategy).armiesToPlace);
    iVar2 = *(this->super_PlayerStrategy).armiesToPlace;
  }
  return iVar2;
}

Assistant:

int AggressiveBotStrategy::reinforceArmyCount() {
    Map::Country* biggest = nullptr;
    for (auto* country : *player->getOwnedCountries()) {
        if (biggest == nullptr || country->getNumberOfTroops() > biggest->getNumberOfTroops()) {
            biggest = country;
        }
    }

    if (biggest != nullptr && biggest->getCountryId() == to->getCountryId()) {
        std::cout << *armiesToPlace;
        return *armiesToPlace;
    }
    std::cout << "0";
    return 0;
}